

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_7f0079::SourceLineSynchronizer::syncToMostRecentString
          (SourceLineSynchronizer *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = std::function<int_()>::operator()(&this->getLastSourceIndex);
  iVar1 = this->lastSource;
  if (iVar2 != iVar1) {
    if ((iVar1 != -1) || (this->lastLine != 0)) {
      std::__cxx11::string::push_back((char)this->output);
    }
    iVar3 = std::function<int_()>::operator()(&this->getLastSourceIndex);
    this->lastSource = iVar3;
    this->lastLine = -1;
  }
  return iVar2 != iVar1;
}

Assistant:

bool syncToMostRecentString() {
        if (getLastSourceIndex() != lastSource) {
            // After switching to a new source string, we need to reset lastLine
            // because line number resets every time a new source string is
            // used. We also need to output a newline to separate the output
            // from the previous source string (if there is one).
            if (lastSource != -1 || lastLine != 0)
                *output += '\n';
            lastSource = getLastSourceIndex();
            lastLine = -1;
            return true;
        }
        return false;
    }